

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int databaseIsUnmoved(Pager *pPager)

{
  long lVar1;
  sqlite3_file *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int bHasMoved;
  void *in_stack_ffffffffffffffd8;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)&in_RDI[2].pMethods == '\0') {
    if (*(int *)&in_RDI[4].pMethods == 0) {
      local_10 = 0;
    }
    else {
      local_10 = sqlite3OsFileControl(in_RDI,-0x55555556,in_stack_ffffffffffffffd8);
      if (local_10 == 0xc) {
        local_10 = 0;
      }
    }
  }
  else {
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int databaseIsUnmoved(Pager *pPager){
  int bHasMoved = 0;
  int rc;

  if( pPager->tempFile ) return SQLITE_OK;
  if( pPager->dbSize==0 ) return SQLITE_OK;
  assert( pPager->zFilename && pPager->zFilename[0] );
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_HAS_MOVED, &bHasMoved);
  if( rc==SQLITE_NOTFOUND ){
    /* If the HAS_MOVED file-control is unimplemented, assume that the file
    ** has not been moved.  That is the historical behavior of SQLite: prior to
    ** version 3.8.3, it never checked */
    rc = SQLITE_OK;
  }else if( rc==SQLITE_OK && bHasMoved ){
    rc = SQLITE_READONLY_DBMOVED;
  }
  return rc;
}